

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::DatabaseInterface::add_imported_metadata
          (DatabaseInterface *this,ExportedMetadataHeader *header)

{
  ExportedMetadataHeader *local_18;
  ExportedMetadataHeader *header_local;
  DatabaseInterface *this_local;
  
  local_18 = header;
  header_local = (ExportedMetadataHeader *)this;
  std::
  vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ::push_back(&this->impl->imported_metadata,&local_18);
  return;
}

Assistant:

void DatabaseInterface::add_imported_metadata(const ExportedMetadataHeader *header)
{
	impl->imported_metadata.push_back(header);
}